

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O2

int __thiscall
gmlc::utilities::string_viewOps::trailingStringInt
          (string_viewOps *this,string_view input,string_view *output,int defNum)

{
  ulong uVar1;
  int iVar2;
  ulong __n;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  string_view input_00;
  string_view input_local;
  
  pbVar3 = (basic_string_view<char,_std::char_traits<char>_> *)input._M_str;
  input_local._M_str = (char *)input._M_len;
  iVar2 = (int)output;
  if ((this == (string_viewOps *)0x0) ||
     ((byte)((input_local._M_str + -1)[(long)this] - 0x3aU) < 0xf6)) {
    pbVar3->_M_len = (size_t)this;
    pbVar3->_M_str = input_local._M_str;
  }
  else {
    input_local._M_len = (size_t)this;
    __n = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                    (&input_local,"0123456789",0xffffffffffffffff,10);
    if (__n == 0xffffffffffffffff) {
      if (input_local._M_len < 0xb) {
        pbVar3->_M_len = 0;
        pbVar3->_M_str = (char *)0x0;
        input_00._M_str = input_local._M_str;
        input_00._M_len = input_local._M_len;
        iVar2 = toIntSimple(input_00);
        return iVar2;
      }
      __n = input_local._M_len - 10;
    }
    if (__n == input_local._M_len - 2) {
      iVar2 = input_local._M_str[input_local._M_len - 1] + -0x30;
    }
    else if ((input_local._M_len < 0xb) || (uVar1 = input_local._M_len - 10, uVar1 <= __n)) {
      bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&input_local,__n + 1,0xffffffffffffffff);
      iVar2 = toIntSimple((string_view)bVar4);
    }
    else {
      bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&input_local,input_local._M_len - 9,0xffffffffffffffff);
      iVar2 = toIntSimple((string_view)bVar4);
      __n = uVar1;
    }
    if ((input_local._M_str[__n] != '_') && (input_local._M_str[__n] != '#')) {
      __n = __n + 1;
    }
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&input_local,0,__n);
    *pbVar3 = bVar4;
  }
  return iVar2;
}

Assistant:

int trailingStringInt(
    std::string_view input,
    std::string_view& output,
    int defNum)
{
    if (input.empty() || (input.back() < '0' || input.back() > '9')) {
        output = input;
        return defNum;
    }
    int num = defNum;
    auto pos1 = input.find_last_not_of(digits);
    if (pos1 == std::string_view::npos)  // in case the whole thing is a number
    {
        if (input.length() <= 10) {
            output = std::string_view{};
            num = toIntSimple(input);
            return num;
        }
        pos1 = input.length() - 10;
    }
    size_t length = input.length();
    if (pos1 == length - 2) {
        num = input.back() - '0';
    } else if (length <= 10 || pos1 >= length - 10) {
        num = toIntSimple(input.substr(pos1 + 1));
    } else {
        num = toIntSimple(input.substr(length - 9));
        pos1 = length - 10;
    }

    if (input[pos1] == '_' || input[pos1] == '#') {
        output = input.substr(0, pos1);
    } else {
        output = input.substr(0, pos1 + 1);
    }

    return num;
}